

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcLampType::IfcLampType(IfcLampType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcLampType";
  Schema_2x3::IfcFlowTerminalType::IfcFlowTerminalType
            (&this->super_IfcFlowTerminalType,&PTR_construction_vtable_24__0083e0d0);
  *(undefined8 *)&(this->super_IfcFlowTerminalType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x83df50;
  *(undefined8 *)&this->field_0x1e0 = 0x83e0b8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x83df78;
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x83dfa0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x83dfc8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x83dff0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x83e018;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x83e040;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x83e068;
  *(undefined8 *)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x83e090;
  *(undefined1 **)&(this->super_IfcFlowTerminalType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcLampType() : Object("IfcLampType") {}